

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cc
# Opt level: O0

string * __thiscall
(anonymous_namespace)::replace(std::__cxx11::string&,Region_const&)::$_0::operator()::
string_const___const(anon_class_8_1_696c1832 *this,string *in)

{
  bool bVar1;
  long *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  
  __lhs = in_RDI;
  bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffc8);
  if (bVar1) {
    std::__cxx11::string::string((string *)__lhs,(string *)*in_RSI);
  }
  else {
    bVar1 = std::operator==(__lhs,in_stack_ffffffffffffffc8);
    if (bVar1) {
      std::__cxx11::string::string((string *)__lhs,(string *)(*in_RSI + 0x20));
    }
    else {
      std::__cxx11::string::string((string *)__lhs);
    }
  }
  return in_RDI;
}

Assistant:

void replace(std::string& str, const Region& region) {
  replace(str, "region", [&] (const std::string& in) {
      if (in == "short") {
        return region.nameShort;
      } else if (in == "long") {
        return region.nameLong;
      }
      return std::string();
    });
}